

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O0

Token * __thiscall slang::syntax::SyntaxNode::getFirstTokenPtr(SyntaxNode *this)

{
  bool bVar1;
  SyntaxNode *this_00;
  SyntaxNode *pSVar2;
  Token *pTVar3;
  Token *result;
  PtrTokenOrSyntax child;
  size_t i;
  size_t childCount;
  SyntaxNode *in_stack_ffffffffffffffb8;
  SyntaxNode *in_stack_ffffffffffffffc0;
  SyntaxNode *local_20;
  
  this_00 = (SyntaxNode *)getChildCount(in_stack_ffffffffffffffb8);
  local_20 = (SyntaxNode *)0x0;
  do {
    if (this_00 <= local_20) {
      return (Token *)0x0;
    }
    in_stack_ffffffffffffffc0 =
         (SyntaxNode *)getChildPtr(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    bVar1 = PtrTokenOrSyntax::isToken((PtrTokenOrSyntax *)0x2a845a);
    if (bVar1) {
      pTVar3 = PtrTokenOrSyntax::token((PtrTokenOrSyntax *)0x2a846a);
      if (pTVar3 != (Token *)0x0) {
        pTVar3 = PtrTokenOrSyntax::token((PtrTokenOrSyntax *)0x2a847a);
        return pTVar3;
      }
    }
    else {
      pSVar2 = PtrTokenOrSyntax::node((PtrTokenOrSyntax *)0x2a848d);
      if (pSVar2 != (SyntaxNode *)0x0) {
        PtrTokenOrSyntax::node((PtrTokenOrSyntax *)0x2a849d);
        pTVar3 = getFirstTokenPtr(this_00);
        if (pTVar3 != (Token *)0x0) {
          return pTVar3;
        }
        in_stack_ffffffffffffffb8 = (SyntaxNode *)0x0;
      }
    }
    local_20 = (SyntaxNode *)((long)&local_20->kind + 1);
  } while( true );
}

Assistant:

parsing::Token* SyntaxNode::getFirstTokenPtr() {
    size_t childCount = getChildCount();
    for (size_t i = 0; i < childCount; i++) {
        auto child = getChildPtr(i);
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getFirstTokenPtr();
            if (result)
                return result;
        }
    }
    return nullptr;
}